

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  char *message;
  long lVar1;
  AssertHelper local_c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  double dStack_b0;
  double local_a8;
  AssertionResult gtest_ar;
  PositionType newPosition;
  ParticleType particle;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this);
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::getPosition
            (&newPosition,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,54.126,
             -431.35,35.65);
  particle.position.z = newPosition.z;
  particle.position.x = newPosition.x;
  particle.position.y = newPosition.y;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 0x18) {
      return;
    }
    local_a8 = particle.position.z;
    local_b8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         particle.position.x;
    dStack_b0 = particle.position.y;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"newPosition[d]","particle.getPosition()[d]",
               (double *)((long)&newPosition.x + lVar1),(double *)((long)&local_b8.ptr_ + lVar1));
    if (gtest_ar.success_ == false) break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar1 = lVar1 + 8;
  }
  testing::Message::Message((Message *)&local_b8);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
             ,0x7b,message);
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetPosition)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;

    ParticleType particle = this->randomParticle();
    PositionType newPosition = this->getPosition(54.126, -431.35, 35.65);
    particle.setPosition(newPosition);
    ASSERT_EQ_VECTOR(newPosition, particle.getPosition(), this->dimension);
}